

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O3

ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> * __thiscall
immutable::ref<immutable::rrb_details::internal_node<immutable::vector<char,false,5>,true>>::
operator=(ref<immutable::rrb_details::internal_node<immutable::vector<char,false,5>,true>> *this,
         ref<immutable::rrb_details::leaf_node<immutable::vector<char,_false,_5>,_true>_> *r)

{
  leaf_node<immutable::vector<char,_false,_5>,_true> *plVar1;
  internal_node<immutable::vector<char,_false,_5>,_true> *p_node;
  
  plVar1 = r->ptr;
  if (plVar1 != (leaf_node<immutable::vector<char,_false,_5>,_true> *)0x0) {
    LOCK();
    (plVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (plVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  p_node = *(internal_node<immutable::vector<char,_false,_5>,_true> **)this;
  *(leaf_node<immutable::vector<char,_false,_5>,_true> **)this = plVar1;
  rrb_details::release<immutable::vector<char,false,5>>(p_node);
  return (ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_5>,_true>_> *)
         this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<U>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }